

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,StringPiece name,int *value)

{
  internal *piVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *__n;
  difference_type __d;
  EnumEntry *pEVar6;
  
  pcVar5 = name.ptr_;
  piVar1 = this + (long)enums * 0x18;
  if (0 < (long)enums) {
    do {
      pEVar6 = (EnumEntry *)((ulong)enums >> 1);
      pcVar2 = *(char **)(this + (long)pEVar6 * 0x18 + 8);
      __n = pcVar2;
      if ((long)pcVar5 <= (long)pcVar2) {
        __n = pcVar5;
      }
      iVar4 = memcmp(*(void **)(this + (long)pEVar6 * 0x18),(void *)size,(size_t)__n);
      if (iVar4 < 0 || iVar4 == 0 && (long)pcVar2 < (long)pcVar5) {
        this = this + (long)pEVar6 * 0x18 + 0x18;
        pEVar6 = (EnumEntry *)((long)&(enums->name).ptr_ + ~(ulong)pEVar6);
      }
      enums = pEVar6;
    } while (0 < (long)pEVar6);
  }
  if (((this == piVar1) || (pcVar2 = *(char **)(this + 8), pcVar2 != pcVar5)) ||
     ((0 < (long)pcVar2 && *(void **)this != (void *)size &&
      (iVar4 = bcmp(*(void **)this,(void *)size,(size_t)pcVar2), iVar4 != 0)))) {
    bVar3 = false;
  }
  else {
    *(undefined4 *)name.length_ = *(undefined4 *)(this + 0x10);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     StringPiece name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}